

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind6-error.c
# Opt level: O0

int run_test_tcp_bind6_error_fault(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 local_148 [4];
  int r;
  uv_tcp_t server;
  sockaddr_in6 *garbage_addr;
  char garbage [60];
  
  memcpy(&garbage_addr,"blah blah blah blah blah blah blah blah blah blah blah blah",0x3c);
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    garbage[0x34] = '\x01';
    garbage[0x35] = '\0';
    garbage[0x36] = '\0';
    garbage[0x37] = '\0';
  }
  else {
    server.queued_fds = &garbage_addr;
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,local_148);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x71,"r == 0");
      abort();
    }
    iVar1 = uv_tcp_bind(local_148,server.queued_fds,0);
    if (iVar1 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x73,"r == UV_EINVAL");
      abort();
    }
    uv_close(local_148,close_cb);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (close_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x79,"close_cb_called == 1");
      abort();
    }
    loop = (uv_loop_t *)uv_default_loop();
    close_loop(loop);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x7b,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    garbage[0x34] = '\0';
    garbage[0x35] = '\0';
    garbage[0x36] = '\0';
    garbage[0x37] = '\0';
  }
  iVar1._0_1_ = garbage[0x34];
  iVar1._1_1_ = garbage[0x35];
  iVar1._2_1_ = garbage[0x36];
  iVar1._3_1_ = garbage[0x37];
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind6_error_fault) {
  char garbage[] =
      "blah blah blah blah blah blah blah blah blah blah blah blah";
  struct sockaddr_in6* garbage_addr;
  uv_tcp_t server;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  garbage_addr = (struct sockaddr_in6*) &garbage;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) garbage_addr, 0);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}